

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O2

void __thiscall Balk::func(Balk *this,int degree,double value)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<Term> *el;
  pointer psVar3;
  double extraout_XMM0_Qa;
  vector<double,_std::allocator<double>_> vec;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar3 = (this->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_58 = 0.0;
  uStack_50 = 0;
  for (; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar2->is_unknown == true) &&
       ((peVar2->initial_variable != false ||
        ((peVar2->shift != 0 && (peVar2->shift != this->balk_size)))))) {
      (*peVar2->_vptr_Term[2])(value,peVar2,degree);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_48,&local_60);
    }
    else {
      (*peVar2->_vptr_Term[2])(value,peVar2,degree);
      local_58 = local_58 + extraout_XMM0_Qa;
    }
  }
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&this->A,(vector<double,_std::allocator<double>_> *)&local_48);
  local_60 = -local_58;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->b,&local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void Balk::func(int degree, double value)
{
    std::vector<double> vec;
    double right_part = 0;
    for (auto &el : terms)
    {
        if ((el->isUnknown()) && (el->initial_variable || ((el->getShift() != 0) && (el->getShift() != balk_size))))
        {
            vec.push_back(el->calculate(value, degree));
        }
        else
        {
            right_part += el->calculate(value, degree);
        }
    }
    A.push_back(std::move(vec));
    b.push_back(-right_part);
}